

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_resetWithVariable_Test::Clone_resetWithVariable_Test(Clone_resetWithVariable_Test *this)

{
  Clone_resetWithVariable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Clone_resetWithVariable_Test_00124fe0;
  return;
}

Assistant:

TEST(Clone, resetWithVariable)
{
    auto r = libcellml::Reset::create();
    auto v = libcellml::Variable::create();

    r->setId("unique");
    r->setOrder(22);
    r->setVariable(v);

    auto rClone = r->clone();

    compareReset(r, rClone);
}